

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

void __thiscall cmComputeLinkDepends::InferDependencies(cmComputeLinkDepends *this)

{
  bool bVar1;
  size_type sVar2;
  reference ppDVar3;
  reference pDVar4;
  set<int,_std::less<int>,_std::allocator<int>_> *psVar5;
  vector<cmGraphEdge,std::allocator<cmGraphEdge>> *this_00;
  iterator __first;
  iterator __last;
  insert_iterator<cmComputeLinkDepends::DependSet> iVar6;
  __normal_iterator<cmGraphEdge_*,_std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>_>
  local_108;
  const_iterator local_100;
  vector<cmGraphEdge,std::allocator<cmGraphEdge>> *local_f8;
  cmGraphEdgeList *edges;
  _Base_ptr local_e8;
  _Base_ptr local_d0;
  insert_iterator<cmComputeLinkDepends::DependSet> local_c8;
  _Rb_tree_const_iterator<int> local_b8;
  _Rb_tree_const_iterator<int> local_b0;
  _Rb_tree_const_iterator<int> local_a8;
  _Rb_tree_const_iterator<int> local_a0;
  undefined1 local_98 [8];
  DependSet intersection;
  undefined1 local_60 [8];
  DependSet common;
  __normal_iterator<const_cmComputeLinkDepends::DependSet_*,_std::vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>_>
  local_28;
  const_iterator i;
  DependSetList *sets;
  uint depender_index;
  cmComputeLinkDepends *this_local;
  
  sets._4_4_ = 0;
  while( true ) {
    sVar2 = std::
            vector<cmComputeLinkDepends::DependSetList_*,_std::allocator<cmComputeLinkDepends::DependSetList_*>_>
            ::size(&this->InferredDependSets);
    if (sVar2 <= sets._4_4_) break;
    ppDVar3 = std::
              vector<cmComputeLinkDepends::DependSetList_*,_std::allocator<cmComputeLinkDepends::DependSetList_*>_>
              ::operator[](&this->InferredDependSets,(ulong)sets._4_4_);
    i._M_current = (DependSet *)*ppDVar3;
    if (i._M_current != (DependSet *)0x0) {
      bVar1 = std::
              vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
              ::empty((vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
                       *)i._M_current);
      if (!bVar1) {
        common.super_set<int,_std::less<int>,_std::allocator<int>_>._M_t._M_impl.
        super__Rb_tree_header._M_node_count =
             (size_t)std::
                     vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
                     ::begin((vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
                              *)i._M_current);
        __gnu_cxx::
        __normal_iterator<cmComputeLinkDepends::DependSet_const*,std::vector<cmComputeLinkDepends::DependSet,std::allocator<cmComputeLinkDepends::DependSet>>>
        ::__normal_iterator<cmComputeLinkDepends::DependSet*>
                  ((__normal_iterator<cmComputeLinkDepends::DependSet_const*,std::vector<cmComputeLinkDepends::DependSet,std::allocator<cmComputeLinkDepends::DependSet>>>
                    *)&local_28,
                   (__normal_iterator<cmComputeLinkDepends::DependSet_*,_std::vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>_>
                    *)&common.super_set<int,_std::less<int>,_std::allocator<int>_>._M_t._M_impl.
                       super__Rb_tree_header._M_node_count);
        pDVar4 = __gnu_cxx::
                 __normal_iterator<const_cmComputeLinkDepends::DependSet_*,_std::vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>_>
                 ::operator*(&local_28);
        DependSet::DependSet((DependSet *)local_60,pDVar4);
        __gnu_cxx::
        __normal_iterator<const_cmComputeLinkDepends::DependSet_*,_std::vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>_>
        ::operator++(&local_28);
        while( true ) {
          intersection.super_set<int,_std::less<int>,_std::allocator<int>_>._M_t._M_impl.
          super__Rb_tree_header._M_node_count =
               (size_t)std::
                       vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
                       ::end((vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
                              *)i._M_current);
          bVar1 = __gnu_cxx::operator!=
                            (&local_28,
                             (__normal_iterator<cmComputeLinkDepends::DependSet_*,_std::vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>_>
                              *)&intersection.super_set<int,_std::less<int>,_std::allocator<int>_>.
                                 _M_t._M_impl.super__Rb_tree_header._M_node_count);
          if (!bVar1) break;
          DependSet::DependSet((DependSet *)local_98);
          local_a0._M_node =
               (_Base_ptr)
               std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                         ((set<int,_std::less<int>,_std::allocator<int>_> *)local_60);
          local_a8._M_node =
               (_Base_ptr)
               std::set<int,_std::less<int>,_std::allocator<int>_>::end
                         ((set<int,_std::less<int>,_std::allocator<int>_> *)local_60);
          psVar5 = &__gnu_cxx::
                    __normal_iterator<const_cmComputeLinkDepends::DependSet_*,_std::vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>_>
                    ::operator->(&local_28)->super_set<int,_std::less<int>,_std::allocator<int>_>;
          local_b0._M_node =
               (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::begin(psVar5);
          psVar5 = &__gnu_cxx::
                    __normal_iterator<const_cmComputeLinkDepends::DependSet_*,_std::vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>_>
                    ::operator->(&local_28)->super_set<int,_std::less<int>,_std::allocator<int>_>;
          local_b8._M_node =
               (_Base_ptr)std::set<int,_std::less<int>,_std::allocator<int>_>::end(psVar5);
          local_d0 = (_Base_ptr)
                     std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                               ((set<int,_std::less<int>,_std::allocator<int>_> *)local_98);
          iVar6 = std::inserter<cmComputeLinkDepends::DependSet>
                            ((DependSet *)local_98,(iterator)local_d0);
          local_c8 = iVar6;
          iVar6 = std::
                  set_intersection<std::_Rb_tree_const_iterator<int>,std::_Rb_tree_const_iterator<int>,std::insert_iterator<cmComputeLinkDepends::DependSet>>
                            (local_a0,local_a8,local_b0,local_b8,iVar6);
          local_e8 = (_Base_ptr)iVar6.iter._M_node;
          edges = (cmGraphEdgeList *)iVar6.container;
          DependSet::operator=((DependSet *)local_60,(DependSet *)local_98);
          DependSet::~DependSet((DependSet *)local_98);
          __gnu_cxx::
          __normal_iterator<const_cmComputeLinkDepends::DependSet_*,_std::vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>_>
          ::operator++(&local_28);
        }
        this_00 = (vector<cmGraphEdge,std::allocator<cmGraphEdge>> *)
                  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::operator[]
                            (&(this->EntryConstraintGraph).
                              super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
                             (ulong)sets._4_4_);
        local_f8 = this_00;
        local_108._M_current =
             (cmGraphEdge *)
             std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::end
                       ((vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *)this_00);
        __gnu_cxx::
        __normal_iterator<cmGraphEdge_const*,std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>>::
        __normal_iterator<cmGraphEdge*>
                  ((__normal_iterator<cmGraphEdge_const*,std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>>
                    *)&local_100,&local_108);
        __first = std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_60);
        __last = std::set<int,_std::less<int>,_std::allocator<int>_>::end
                           ((set<int,_std::less<int>,_std::allocator<int>_> *)local_60);
        std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>::
        insert<std::_Rb_tree_const_iterator<int>,void>
                  (this_00,local_100,(_Rb_tree_const_iterator<int>)__first._M_node,
                   (_Rb_tree_const_iterator<int>)__last._M_node);
        DependSet::~DependSet((DependSet *)local_60);
      }
    }
    sets._4_4_ = sets._4_4_ + 1;
  }
  return;
}

Assistant:

void cmComputeLinkDepends::InferDependencies()
{
  // The inferred dependency sets for each item list the possible
  // dependencies.  The intersection of the sets for one item form its
  // inferred dependencies.
  for (unsigned int depender_index = 0;
       depender_index < this->InferredDependSets.size(); ++depender_index) {
    // Skip items for which dependencies do not need to be inferred or
    // for which the inferred dependency sets are empty.
    DependSetList* sets = this->InferredDependSets[depender_index];
    if (!sets || sets->empty()) {
      continue;
    }

    // Intersect the sets for this item.
    DependSetList::const_iterator i = sets->begin();
    DependSet common = *i;
    for (++i; i != sets->end(); ++i) {
      DependSet intersection;
      std::set_intersection(common.begin(), common.end(), i->begin(), i->end(),
                            std::inserter(intersection, intersection.begin()));
      common = intersection;
    }

    // Add the inferred dependencies to the graph.
    cmGraphEdgeList& edges = this->EntryConstraintGraph[depender_index];
    edges.insert(edges.end(), common.begin(), common.end());
  }
}